

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
google::protobuf::internal::anon_unknown_36::GenerateFieldNames
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Descriptor *descriptor,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  pointer pFVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer __dest;
  allocator_type local_42;
  value_type_conflict5 local_41;
  char *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  uVar7 = entries.len_;
  pFVar8 = entries.ptr_;
  if (uVar7 == 0) {
    lVar5 = 0;
  }
  else {
    lVar9 = 0;
    lVar5 = 0;
    do {
      if ((&pFVar8->utf8_check_mode)[lVar9] != kNone) {
        lVar5 = lVar5 + (ulong)**(ushort **)(*(long *)((long)&pFVar8->field + lVar9) + 8);
      }
      lVar9 = lVar9 + 0x18;
    } while (uVar7 * 0x18 != lVar9);
  }
  if (lVar5 == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_40 = (descriptor->all_names_).payload_;
    uVar1 = *(ushort *)(local_40 + 2);
    uVar11 = (ulong)uVar1;
    uVar3 = 0xff;
    if (uVar1 < 0xff) {
      uVar3 = (uint)uVar1;
    }
    local_41 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,(uVar7 & 0xfffffffffffffff8) + lVar5 + (ulong)uVar3 + 8,
               &local_41,&local_42);
    pcVar4 = local_40;
    puVar6 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *puVar6 = (uchar)uVar3;
    if (uVar7 == 0) {
      uVar10 = 7;
    }
    else {
      lVar9 = 0;
      lVar5 = 0;
      do {
        if ((&pFVar8->utf8_check_mode)[lVar9] != kNone) {
          puVar6[lVar5 + 1] = **(uchar **)(*(long *)((long)&pFVar8->field + lVar9) + 8);
        }
        lVar5 = lVar5 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar7 * 0x18 != lVar9);
      uVar10 = (ulong)(~(uint)lVar5 & 7);
      puVar6 = puVar6 + lVar5;
    }
    __dest = puVar6 + uVar10 + 1;
    local_38 = __return_storage_ptr__;
    if (uVar1 < 0x100) {
      if (uVar11 != 0) {
        memcpy(__dest,local_40 + ~uVar11,uVar11);
        __dest = __dest + uVar11;
      }
    }
    else {
      memcpy(__dest,local_40 + ~uVar11,0x7e);
      (puVar6 + uVar10 + 0x7f)[0] = '.';
      (puVar6 + uVar10 + 0x7f)[1] = '.';
      puVar6[uVar10 + 0x81] = '.';
      memcpy(puVar6 + uVar10 + 0x82,pcVar4 + -0x7f,0x7e);
      __dest = puVar6 + uVar10 + 0x100;
    }
    __return_storage_ptr__ = local_38;
    if (uVar7 != 0) {
      lVar5 = 0;
      do {
        if ((&pFVar8->utf8_check_mode)[lVar5] != kNone) {
          puVar2 = *(ushort **)(*(long *)((long)&pFVar8->field + lVar5) + 8);
          uVar11 = (ulong)*puVar2;
          if (uVar11 != 0) {
            memcpy(__dest,(void *)((long)puVar2 + ~uVar11),uVar11);
            __dest = __dest + uVar11;
          }
        }
        lVar5 = lVar5 + 0x18;
        __return_storage_ptr__ = local_38;
      } while (uVar7 * 0x18 != lVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> GenerateFieldNames(
    const Descriptor* descriptor,
    const absl::Span<const TailCallTableInfo::FieldEntryInfo> entries,
    const TailCallTableInfo::MessageOptions& message_options,
    absl::Span<const TailCallTableInfo::FieldOptions> fields) {
  static constexpr size_t kMaxNameLength = 255;

  size_t field_name_total_size = 0;
  const auto for_each_field_name = [&](auto with_name, auto no_name) {
    for (const auto& entry : entries) {
      // We only need field names for reporting UTF-8 parsing errors, so we only
      // emit them for string fields with Utf8 transform specified.
      if (entry.utf8_check_mode != cpp::Utf8CheckMode::kNone) {
        with_name(absl::string_view(entry.field->name()));
      } else {
        no_name();
      }
    }
  };

  for_each_field_name([&](auto name) { field_name_total_size += name.size(); },
                      [] {});

  // No names needed. Omit the whole table.
  if (field_name_total_size == 0) {
    return {};
  }

  const absl::string_view message_name = descriptor->full_name();
  uint8_t message_name_size =
      static_cast<uint8_t>(std::min(message_name.size(), kMaxNameLength));
  size_t total_byte_size =
      ((/* message */ 1 + /* fields */ entries.size() + /* round up */ 7) &
       ~7) +
      message_name_size + field_name_total_size;

  std::vector<uint8_t> out_vec(total_byte_size, uint8_t{0});
  uint8_t* out_it = out_vec.data();

  // First, we output the size of each string, as an unsigned byte. The first
  // string is the message name.
  int count = 1;
  *out_it++ = message_name_size;
  for_each_field_name(
      [&](auto name) {
        *out_it++ = static_cast<uint8_t>(name.size());
        ++count;
      },
      [&] {
        ++out_it;
        ++count;
      });
  // align to an 8-byte boundary
  out_it += -count & 7;

  const auto append = [&](absl::string_view str) {
    if (!str.empty()) {
      memcpy(out_it, str.data(), str.size());
      out_it += str.size();
    }
  };

  // The message name is stored at the beginning of the string
  if (message_name.size() > kMaxNameLength) {
    static constexpr int kNameHalfLength = (kMaxNameLength - 3) / 2;
    append(message_name.substr(0, kNameHalfLength));
    append("...");
    append(message_name.substr(message_name.size() - kNameHalfLength));
  } else {
    append(message_name);
  }
  // Then we output the actual field names
  for_each_field_name([&](auto name) { append(name); }, [] {});

  return out_vec;
}